

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O1

void __thiscall GslSpan_Subspan_Test::TestBody(GslSpan_Subspan_Test *this)

{
  int *piVar1;
  extent_type<_1L> eVar2;
  char *pcVar3;
  long lVar4;
  span<int,__1L> sVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_13;
  span<int,_5L> av;
  int arr [5];
  AssertHelper local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_48 = &DAT_200000001;
  uStack_40 = 0x400000003;
  local_38 = 5;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80.data_._0_4_ = 2;
  local_58 = (undefined1  [8])&local_48;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"(av.subspan<2, 2> ().length ())","2",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,2,2);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (2, 2).length ()","2",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,2,3);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (2, 3).length ()","3",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x32c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80.data_._0_4_ = 0;
  local_58 = (undefined1  [8])&local_48;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"(av.subspan<0, 0> ().length ())","0",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x330,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,0,0);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (0, 0).length ()","0",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x331,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5;
  local_80.data_._0_4_ = 5;
  local_58 = (undefined1  [8])&local_48;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"(av.subspan<0, 5> ().length ())","5",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x335,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,0,5);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"(av.subspan (0, 5).length ())","5",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80.data_._0_4_ = 0;
  local_58 = (undefined1  [8])&local_48;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"(av.subspan<4, 0> ().length ())","0",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,4,0);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (4, 0).length ()","0",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_5L>::subspan((span<int,_5L> *)local_58,5,0);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (5, 0).length ()","0",(long *)&local_68,
             (int *)&local_80);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x33c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_78 = (undefined1  [8])0x0;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_58,"(av.subspan<0, 0> ().length ())","0",(long *)&local_68,
             (int *)&local_80);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x340,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  sVar5 = pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_78,0,0);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_58,"av.subspan (0, 0).length ()","0",(long *)&local_68,
             (int *)&local_80);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x341,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_78,0);
  local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_58,"av.subspan (0).length ()","0",(long *)local_78,(int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x345,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  local_58 = (undefined1  [8])&DAT_00000005;
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_78,5);
  local_80.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_68,"av.subspan (0).length ()","5",(long *)local_78,(int *)&local_80)
  ;
  if (local_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x349,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  sVar5 = pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_58,1,-1);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (1).length ()","4",(long *)&local_68,(int *)&local_80)
  ;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_58,4,-1);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (4).length ()","1",(long *)&local_68,(int *)&local_80)
  ;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_58,5,-1);
  local_68._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       sVar5.storage_.super_extent_type<_1L>.size_;
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (5).length ()","0",(long *)&local_68,(int *)&local_80)
  ;
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x34c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  sVar5 = pstore::gsl::span<int,_-1L>::subspan((span<int,__1L> *)local_58,1,-1);
  piVar1 = sVar5.storage_.data_;
  lVar4 = 0;
  eVar2.size_ = sVar5.storage_.super_extent_type<_1L>.size_.size_;
  if (sVar5.storage_.super_extent_type<_1L>.size_.size_ < 1) {
    eVar2.size_ = lVar4;
  }
  do {
    if (eVar2.size_ == lVar4) {
      pstore::assert_failed
                ("idx >= 0 && idx < storage_.size ()",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                 ,0x18a);
    }
    local_68._M_head_impl._0_4_ = (int)lVar4 + 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_78,"av2[i]","i + 2",piVar1,(int *)&local_68);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
      if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (pbStack_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x34f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if (local_68._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
    lVar4 = lVar4 + 1;
    piVar1 = piVar1 + 1;
  } while (lVar4 != 4);
  local_58 = (undefined1  [8])&DAT_00000005;
  local_68._M_head_impl._0_4_ = 5;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (0).length ()","5",(long *)local_58,(int *)&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x354,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_58 = (undefined1  [8])&DAT_00000004;
  local_68._M_head_impl._0_4_ = 4;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (1).length ()","4",(long *)local_58,(int *)&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x355,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_58 = (undefined1  [8])0x1;
  local_68._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (4).length ()","1",(long *)local_58,(int *)&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x356,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_58 = (undefined1  [8])0x0;
  local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_78,"av.subspan (5).length ()","0",(long *)local_58,(int *)&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar3 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x357,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (local_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  piVar1 = (int *)((long)&local_48 + 4);
  lVar4 = -4;
  do {
    local_58._0_4_ = (int)lVar4 + 6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_78,"av2[i]","i + 2",piVar1,(int *)local_58);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_58);
      pcVar3 = anon_var_dwarf_d47bc + 0x50;
      if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (pbStack_70->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x35a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if (local_58 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_58 + 8))();
      }
    }
    if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_70,pbStack_70);
    }
    piVar1 = piVar1 + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  return;
}

Assistant:

TEST (GslSpan, Subspan) {
    int arr[5] = {1, 2, 3, 4, 5};

    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<2, 2> ().length ()), 2);
        EXPECT_EQ (av.subspan (2, 2).length (), 2);
        EXPECT_EQ (av.subspan (2, 3).length (), 3);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<0, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (0, 0).length (), 0);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<0, 5> ().length ()), 5);
        EXPECT_EQ ((av.subspan (0, 5).length ()), 5);
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ ((av.subspan<4, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (4, 0).length (), 0);
        EXPECT_EQ (av.subspan (5, 0).length (), 0);
    }
    {
        span<int> av;
        EXPECT_EQ ((av.subspan<0, 0> ().length ()), 0);
        EXPECT_EQ (av.subspan (0, 0).length (), 0);
    }
    {
        span<int> av;
        EXPECT_EQ (av.subspan (0).length (), 0);
    }
    {
        span<int> av = make_span (arr);
        EXPECT_EQ (av.subspan (0).length (), 5);
        EXPECT_EQ (av.subspan (1).length (), 4);
        EXPECT_EQ (av.subspan (4).length (), 1);
        EXPECT_EQ (av.subspan (5).length (), 0);
        auto av2 = av.subspan (1);
        for (int i = 0; i < 4; ++i) {
            EXPECT_EQ (av2[i], i + 2);
        }
    }
    {
        span<int, 5> av = make_span (arr);
        EXPECT_EQ (av.subspan (0).length (), 5);
        EXPECT_EQ (av.subspan (1).length (), 4);
        EXPECT_EQ (av.subspan (4).length (), 1);
        EXPECT_EQ (av.subspan (5).length (), 0);
        auto av2 = av.subspan (1);
        for (int i = 0; i < 4; ++i) {
            EXPECT_EQ (av2[i], i + 2);
        }
    }
}